

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.hpp
# Opt level: O0

string * __thiscall
yactfr::internal::ReadVarInstrOpt<yactfr::VariantTypeOption<long_long>>::toStr_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Size indent)

{
  bool bVar1;
  ostream *poVar2;
  SelectorRangeSet *this_00;
  longlong lVar3;
  Size indent_00;
  string local_208;
  IntegerRange<long_long,_true> *local_1e8;
  IntegerRange<long_long,_true> *range;
  const_iterator __end0;
  const_iterator __begin0;
  SelectorRangeSet *__range3;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss;
  Size indent_local;
  ReadVarInstrOpt<yactfr::VariantTypeOption<long_long>_> *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  indent_abi_cxx11_(&local_1b8,(internal *)indent,indent_00);
  poVar2 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  std::operator<<(poVar2,"<var opt>");
  std::__cxx11::string::~string((string *)&local_1b8);
  this_00 = VariantTypeOption<long_long>::selectorRanges(*this);
  __end0 = IntegerRangeSet<long_long,_true>::begin(this_00);
  range = (IntegerRange<long_long,_true> *)IntegerRangeSet<long_long,_true>::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&range);
    if (!bVar1) break;
    local_1e8 = std::_Rb_tree_const_iterator<yactfr::IntegerRange<long_long,_true>_>::operator*
                          (&__end0);
    poVar2 = std::operator<<((ostream *)local_198," [");
    lVar3 = IntegerRange<long_long,_true>::lower(local_1e8);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
    poVar2 = std::operator<<(poVar2,", ");
    lVar3 = IntegerRange<long_long,_true>::upper(local_1e8);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
    std::operator<<(poVar2,"]");
    std::_Rb_tree_const_iterator<yactfr::IntegerRange<long_long,_true>_>::operator++(&__end0);
  }
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)local_198,std::endl<char,std::char_traits<char>>);
  Proc::toStr_abi_cxx11_(&local_208,(Proc *)((long)this + 8),indent + 1);
  std::operator<<(poVar2,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string toStr(const Size indent = 0) const
    {
        std::ostringstream ss;

        ss << internal::indent(indent) << "<var opt>";

        for (const auto& range : _opt->selectorRanges()) {
            ss << " [" << range.lower() << ", " << range.upper() << "]";
        }

        ss << std::endl << _proc.toStr(indent + 1);
        return ss.str();
    }